

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall cursespp::Window::Focus(Window *this)

{
  if (focused != this) {
    if (focused != (Window *)0x0) {
      (*(focused->super_IWindow).super_IOrderable._vptr_IOrderable[8])();
    }
    focused = this;
    this->isDirty = true;
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x34])(this,1);
    RepaintBackground(this);
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[5])(this);
    return;
  }
  return;
}

Assistant:

void Window::Focus() {
    ASSERT_MAIN_THREAD();

    if (::focused != this) {
        if (::focused) { ::focused->Blur(); }
        ::focused = this;
        this->isDirty = true;
        this->OnFocusChanged(true);
        this->RepaintBackground();
        this->Redraw();
    }
}